

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

WitnessVersion __thiscall cfd::core::Script::GetWitnessVersion(Script *this)

{
  bool bVar1;
  ScriptType SVar2;
  const_reference this_00;
  ScriptOperator *this_01;
  int version;
  int num;
  ScriptType val;
  Script *this_local;
  
  bVar1 = IsWitnessProgram(this);
  if (bVar1) {
    this_00 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
              operator[](&this->script_stack_,0);
    this_01 = ScriptElement::GetOpCode(this_00);
    SVar2 = ScriptOperator::GetDataType(this_01);
    if (SVar2 == kOpFalse) {
      return kVersion0;
    }
    if ((0x50 < (int)SVar2) && ((int)SVar2 < 0x61)) {
      return SVar2 - kOpReserved;
    }
  }
  return kVersionNone;
}

Assistant:

WitnessVersion Script::GetWitnessVersion() const {
  if (IsWitnessProgram()) {
    auto val = script_stack_[0].GetOpCode().GetDataType();
    if (kOp_0 == val) {
      return WitnessVersion::kVersion0;
    } else if ((kOp_1 <= val) && (val <= kOp_16)) {
      auto num = val - kOp_1;
      auto version = WitnessVersion::kVersion1 + num;
      return static_cast<WitnessVersion>(version);
    }
  }
  return WitnessVersion::kVersionNone;
}